

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall CVmObjBigNum::sgn_val(CVmObjBigNum *this,vm_val_t *retval,vm_obj_id_t self)

{
  int iVar1;
  vm_val_t *in_RSI;
  long in_RDI;
  
  iVar1 = is_zero(*(char **)(in_RDI + 8));
  if (iVar1 == 0) {
    iVar1 = get_neg(*(char **)(in_RDI + 8));
    if (iVar1 == 0) {
      vm_val_t::set_int(in_RSI,1);
    }
    else {
      vm_val_t::set_int(in_RSI,-1);
    }
  }
  else {
    vm_val_t::set_int(in_RSI,0);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::sgn_val(VMG_ vm_val_t *retval, vm_obj_id_t self)
{
    /* figure the sgn value */
    if (is_zero(ext_))
        retval->set_int(0);
    else if (get_neg(ext_))
        retval->set_int(-1);
    else
        retval->set_int(1);

    /* success */
    return TRUE;
}